

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::str::str<pybind11::detail::accessor_policies::str_attr>
          (str *this,accessor<pybind11::detail::accessor_policies::str_attr> *a)

{
  object *poVar1;
  handle local_18;
  
  poVar1 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(a);
  local_18.m_ptr = (poVar1->super_handle).m_ptr;
  handle::inc_ref(&local_18);
  str(this,(object *)&local_18);
  handle::dec_ref(&local_18);
  return;
}

Assistant:

str(const char *c, const SzType &n)
        : object(PyUnicode_FromStringAndSize(c, ssize_t_cast(n)), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate string object!");
        }
    }